

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

void Curl_expire_ex(Curl_easy *data,curltime *nowp,timediff_t milli,expire_id id)

{
  Curl_llist *list;
  int iVar1;
  undefined4 uVar2;
  Curl_multi *pCVar3;
  long lVar4;
  curl_trc_feat *pcVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  time_node *ptVar10;
  uint uVar11;
  size_t sVar12;
  Curl_llist_node *pCVar13;
  void *pvVar14;
  timediff_t tVar15;
  Curl_tree *pCVar16;
  int iVar17;
  Curl_llist_node *n;
  time_node *ne;
  Curl_llist_node *e;
  long lVar18;
  curltime older;
  curltime older_00;
  curltime newer;
  curltime newer_00;
  curltime i;
  
  pCVar3 = data->multi;
  if (pCVar3 != (Curl_multi *)0x0) {
    uVar2 = *(undefined4 *)&nowp->field_0xc;
    iVar17 = ((int)milli + (int)(milli / 1000) * -1000) * 1000;
    iVar1 = nowp->tv_usec + iVar17;
    iVar17 = nowp->tv_usec + -1000000 + iVar17;
    if (iVar1 < 1000000) {
      iVar17 = iVar1;
    }
    lVar18 = (ulong)(999999 < iVar1) + nowp->tv_sec + milli / 1000;
    multi_deltimeout(data,id);
    list = &(data->state).timeoutlist;
    ne = (data->state).expires + id;
    (data->state).expires[id].time.tv_sec = lVar18;
    (data->state).expires[id].time.tv_usec = iVar17;
    *(undefined4 *)&(data->state).expires[id].time.field_0xc = uVar2;
    (data->state).expires[id].eid = id;
    sVar12 = Curl_llist_count(list);
    if ((sVar12 == 0) || (pCVar13 = Curl_llist_head(list), pCVar13 == (Curl_llist_node *)0x0)) {
      e = (Curl_llist_node *)0x0;
    }
    else {
      e = (Curl_llist_node *)0x0;
      do {
        n = pCVar13;
        pvVar14 = Curl_node_elem(n);
        ptVar10 = (data->state).expires + id;
        uVar6 = (ptVar10->time).tv_sec;
        uVar7 = (ptVar10->time).tv_usec;
        older.tv_usec = uVar7;
        older.tv_sec = uVar6;
        older._12_4_ = 0;
        newer._12_4_ = 0;
        newer._0_12_ = *(undefined1 (*) [12])((long)pvVar14 + 0x20);
        tVar15 = Curl_timediff(newer,older);
        if (0 < tVar15) break;
        pCVar13 = Curl_node_next(n);
        e = n;
      } while (pCVar13 != (Curl_llist_node *)0x0);
    }
    Curl_llist_insert_next(list,e,ne,&ne->list);
    lVar4 = (data->state).expiretime.tv_sec;
    if ((lVar4 != 0) || ((data->state).expiretime.tv_usec != 0)) {
      older_00.tv_usec = (data->state).expiretime.tv_usec;
      older_00.tv_sec = lVar4;
      older_00._12_4_ = 0;
      newer_00.tv_usec = iVar17;
      newer_00.tv_sec = lVar18;
      newer_00._12_4_ = 0;
      tVar15 = Curl_timediff(newer_00,older_00);
      if (0 < tVar15) {
        return;
      }
      uVar11 = Curl_splayremove(pCVar3->timetree,&(data->state).timenode,&pCVar3->timetree);
      if ((((data != (Curl_easy *)0x0) && (uVar11 != 0)) && (((data->set).field_0x8cd & 0x10) != 0))
         && ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level)
             ))) {
        Curl_infof(data,"Internal error removing splay node = %d",(ulong)uVar11);
      }
    }
    (data->state).expiretime.tv_sec = lVar18;
    (data->state).expiretime.tv_usec = iVar17;
    *(undefined4 *)&(data->state).expiretime.field_0xc = uVar2;
    pCVar16 = &(data->state).timenode;
    Curl_splayset(pCVar16,data);
    uVar8 = (data->state).expiretime.tv_sec;
    uVar9 = (data->state).expiretime.tv_usec;
    i.tv_usec = uVar9;
    i.tv_sec = uVar8;
    i._12_4_ = 0;
    pCVar16 = Curl_splayinsert(i,pCVar3->timetree,pCVar16);
    pCVar3->timetree = pCVar16;
  }
  return;
}

Assistant:

static void Curl_expire_ex(struct Curl_easy *data,
                           const struct curltime *nowp,
                           timediff_t milli, expire_id id)
{
  struct Curl_multi *multi = data->multi;
  struct curltime *curr_expire = &data->state.expiretime;
  struct curltime set;

  /* this is only interesting while there is still an associated multi struct
     remaining! */
  if(!multi)
    return;

  DEBUGASSERT(id < EXPIRE_LAST);

  set = *nowp;
  set.tv_sec += (time_t)(milli/1000); /* might be a 64 to 32 bits conversion */
  set.tv_usec += (int)(milli%1000)*1000;

  if(set.tv_usec >= 1000000) {
    set.tv_sec++;
    set.tv_usec -= 1000000;
  }

  /* Remove any timer with the same id just in case. */
  multi_deltimeout(data, id);

  /* Add it to the timer list. It must stay in the list until it has expired
     in case we need to recompute the minimum timer later. */
  multi_addtimeout(data, &set, id);

  if(curr_expire->tv_sec || curr_expire->tv_usec) {
    /* This means that the struct is added as a node in the splay tree.
       Compare if the new time is earlier, and only remove-old/add-new if it
       is. */
    timediff_t diff = Curl_timediff(set, *curr_expire);
    int rc;

    if(diff > 0) {
      /* The current splay tree entry is sooner than this new expiry time.
         We do not need to update our splay tree entry. */
      return;
    }

    /* Since this is an updated time, we must remove the previous entry from
       the splay tree first and then re-add the new value */
    rc = Curl_splayremove(multi->timetree, &data->state.timenode,
                          &multi->timetree);
    if(rc)
      infof(data, "Internal error removing splay node = %d", rc);
  }

  /* Indicate that we are in the splay tree and insert the new timer expiry
     value since it is our local minimum. */
  *curr_expire = set;
  Curl_splayset(&data->state.timenode, data);
  multi->timetree = Curl_splayinsert(*curr_expire, multi->timetree,
                                     &data->state.timenode);
}